

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_stop_times.c
# Opt level: O0

void CGTFS_RecordStopTime(void)

{
  int iVar1;
  greatest_test_res local_10;
  greatest_test_res local_c;
  greatest_test_res res_1;
  greatest_test_res res;
  
  iVar1 = greatest_test_pre("stop_time_read");
  if (iVar1 == 1) {
    local_c = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_c == GREATEST_TEST_RES_PASS) {
      local_c = stop_time_read();
    }
    greatest_test_post(local_c);
  }
  iVar1 = greatest_test_pre("stop_time_compare");
  if (iVar1 == 1) {
    local_10 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_10 == GREATEST_TEST_RES_PASS) {
      local_10 = stop_time_compare();
    }
    greatest_test_post(local_10);
  }
  return;
}

Assistant:

SUITE(CGTFS_RecordStopTime) {
    RUN_TEST(stop_time_read);
    RUN_TEST(stop_time_compare);
}